

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int deleteCell(Rtree *pRtree,RtreeNode *pNode,int iCell,int iHeight)

{
  ulong uVar1;
  int iVar2;
  int local_34;
  int rc;
  RtreeNode *pParent;
  int iHeight_local;
  int iCell_local;
  RtreeNode *pNode_local;
  Rtree *pRtree_local;
  
  local_34 = fixLeafParent(pRtree,pNode);
  pRtree_local._4_4_ = local_34;
  if (local_34 == 0) {
    nodeDeleteCell(pRtree,pNode,iCell);
    if (pNode->pParent != (RtreeNode *)0x0) {
      iVar2 = readInt16(pNode->zData + 2);
      uVar1 = (long)(pRtree->iNodeSize + -4) / (long)(int)(uint)pRtree->nBytesPerCell;
      if (iVar2 < (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 3))
      {
        local_34 = removeNode(pRtree,pNode,iHeight);
      }
      else {
        local_34 = fixBoundingBox(pRtree,pNode);
      }
    }
    pRtree_local._4_4_ = local_34;
  }
  return pRtree_local._4_4_;
}

Assistant:

static int deleteCell(Rtree *pRtree, RtreeNode *pNode, int iCell, int iHeight){
  RtreeNode *pParent;
  int rc;

  if( SQLITE_OK!=(rc = fixLeafParent(pRtree, pNode)) ){
    return rc;
  }

  /* Remove the cell from the node. This call just moves bytes around
  ** the in-memory node image, so it cannot fail.
  */
  nodeDeleteCell(pRtree, pNode, iCell);

  /* If the node is not the tree root and now has less than the minimum
  ** number of cells, remove it from the tree. Otherwise, update the
  ** cell in the parent node so that it tightly contains the updated
  ** node.
  */
  pParent = pNode->pParent;
  assert( pParent || pNode->iNode==1 );
  if( pParent ){
    if( NCELL(pNode)<RTREE_MINCELLS(pRtree) ){
      rc = removeNode(pRtree, pNode, iHeight);
    }else{
      rc = fixBoundingBox(pRtree, pNode);
    }
  }

  return rc;
}